

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

TypeBase *
ResolveGenericTypeAliases
          (ExpressionContext *ctx,SynBase *source,TypeBase *type,IntrusiveList<MatchData> aliases)

{
  longlong length;
  IntrusiveList<TypeHandle> arguments_00;
  IntrusiveList<TypeHandle> generics;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined8 in_RAX;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  TypeBase *pTVar5;
  TypeRef *pTVar6;
  TypeBase *pTVar7;
  TypeArray *pTVar8;
  TypeUnsizedArray *pTVar9;
  undefined4 extraout_var_01;
  TypeGenericClass *pTVar11;
  undefined4 extraout_var_02;
  MatchData *pMVar12;
  char *msg;
  undefined8 *puVar13;
  IntrusiveList<TypeHandle> arguments;
  IntrusiveList<TypeHandle> local_48;
  TypeBase *local_38;
  TypeHandle *pTVar10;
  
  pMVar12 = aliases.head;
  bVar1 = pMVar12 != (MatchData *)0x0 & type->isGeneric;
  pTVar11 = (TypeGenericClass *)CONCAT71((int7)((ulong)in_RAX >> 8),bVar1);
  if (bVar1 != 1) {
    return type;
  }
  if (type == (TypeBase *)0x0) {
LAB_001f5cc4:
    pTVar5 = (TypeBase *)0x0;
  }
  else {
    if (type->typeID == 0xc) {
      return type;
    }
    if ((type == (TypeBase *)0x0) || (pTVar5 = type, type->typeID != 0xd)) goto LAB_001f5cc4;
  }
  if (pTVar5 != (TypeBase *)0x0) {
    bVar2 = InplaceStr::operator==
                      (&pMVar12->name->name,(InplaceStr *)(pTVar5[1]._vptr_TypeBase + 8));
    pTVar11 = (TypeGenericClass *)CONCAT71(extraout_var,bVar2);
    if (bVar2) {
      bVar2 = false;
    }
    else {
      do {
        pMVar12 = pMVar12->next;
        bVar2 = pMVar12 == (MatchData *)0x0;
        if (bVar2) goto LAB_001f5d26;
        bVar3 = InplaceStr::operator==
                          (&pMVar12->name->name,(InplaceStr *)(pTVar5[1]._vptr_TypeBase + 8));
        pTVar11 = (TypeGenericClass *)CONCAT71(extraout_var_00,bVar3);
      } while (!bVar3);
    }
    pTVar11 = (TypeGenericClass *)pMVar12->type;
LAB_001f5d26:
    if (bVar2) {
      pTVar11 = (TypeGenericClass *)ctx->typeGeneric;
    }
  }
  if (pTVar5 != (TypeBase *)0x0) {
    return &pTVar11->super_TypeBase;
  }
  if ((type == (TypeBase *)0x0) || (pTVar5 = type, type->typeID != 0x12)) {
    pTVar5 = (TypeBase *)0x0;
  }
  if (pTVar5 != (TypeBase *)0x0) {
    pTVar5 = ResolveGenericTypeAliases(ctx,source,(TypeBase *)pTVar5[1]._vptr_TypeBase,aliases);
    pTVar6 = ExpressionContext::GetReferenceType(ctx,pTVar5);
    return &pTVar6->super_TypeBase;
  }
  if ((type == (TypeBase *)0x0) || (pTVar5 = type, type->typeID != 0x13)) {
    pTVar5 = (TypeBase *)0x0;
  }
  if (pTVar5 != (TypeBase *)0x0) {
    pTVar7 = ResolveGenericTypeAliases(ctx,source,(TypeBase *)pTVar5[1]._vptr_TypeBase,aliases);
    length._0_4_ = pTVar5[1].typeID;
    length._4_4_ = pTVar5[1].nameHash;
    pTVar8 = ExpressionContext::GetArrayType(ctx,pTVar7,length);
    return &pTVar8->super_TypeBase;
  }
  if ((type == (TypeBase *)0x0) || (pTVar5 = type, type->typeID != 0x14)) {
    pTVar5 = (TypeBase *)0x0;
  }
  if (pTVar5 != (TypeBase *)0x0) {
    pTVar5 = ResolveGenericTypeAliases(ctx,source,*(TypeBase **)&pTVar5[1].typeIndex,aliases);
    pTVar9 = ExpressionContext::GetUnsizedArrayType(ctx,pTVar5);
    return (TypeBase *)pTVar9;
  }
  if ((type == (TypeBase *)0x0) || (pTVar5 = type, type->typeID != 0x15)) {
    pTVar5 = (TypeBase *)0x0;
  }
  if (pTVar5 != (TypeBase *)0x0) {
    local_38 = ResolveGenericTypeAliases(ctx,source,(TypeBase *)pTVar5[1]._vptr_TypeBase,aliases);
    local_48.head = (TypeHandle *)0x0;
    local_48.tail = (TypeHandle *)0x0;
    for (puVar13 = *(undefined8 **)&pTVar5[1].typeID; puVar13 != (undefined8 *)0x0;
        puVar13 = (undefined8 *)puVar13[1]) {
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
      pTVar10 = (TypeHandle *)CONCAT44(extraout_var_01,iVar4);
      pTVar7 = ResolveGenericTypeAliases(ctx,source,(TypeBase *)*puVar13,aliases);
      pTVar10->type = pTVar7;
      pTVar10->next = (TypeHandle *)0x0;
      pTVar10->listed = false;
      IntrusiveList<TypeHandle>::push_back(&local_48,pTVar10);
    }
    arguments_00.tail = local_48.tail;
    arguments_00.head = local_48.head;
    pTVar11 = (TypeGenericClass *)
              ExpressionContext::GetFunctionType(ctx,source,local_38,arguments_00);
  }
  if (pTVar5 != (TypeBase *)0x0) {
    return &pTVar11->super_TypeBase;
  }
  if ((type == (TypeBase *)0x0) || (type->typeID != 0x17)) {
    type = (TypeBase *)0x0;
  }
  if (type != (TypeBase *)0x0) {
    local_48.head = (TypeHandle *)0x0;
    local_48.tail = (TypeHandle *)0x0;
    puVar13 = *(undefined8 **)&type[1].typeID;
    if (puVar13 != (undefined8 *)0x0) {
      bVar1 = 0;
      do {
        pTVar5 = ResolveGenericTypeAliases(ctx,source,(TypeBase *)*puVar13,aliases);
        if (pTVar5 == ctx->typeAuto) {
          msg = "ERROR: \'auto\' type cannot be used as template argument";
          goto LAB_001f5fdb;
        }
        bVar1 = bVar1 & 1 | pTVar5->isGeneric;
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
        pTVar10 = (TypeHandle *)CONCAT44(extraout_var_02,iVar4);
        pTVar10->type = pTVar5;
        pTVar10->next = (TypeHandle *)0x0;
        pTVar10->listed = false;
        IntrusiveList<TypeHandle>::push_back(&local_48,pTVar10);
        puVar13 = (undefined8 *)puVar13[1];
      } while (puVar13 != (undefined8 *)0x0);
      if (bVar1 != 0) {
        generics.tail = local_48.tail;
        generics.head = local_48.head;
        pTVar11 = ExpressionContext::GetGenericClassType
                            (ctx,source,(TypeGenericClassProto *)type[1]._vptr_TypeBase,generics);
        goto LAB_001f5fb2;
      }
    }
    pTVar11 = (TypeGenericClass *)
              CreateGenericTypeInstance
                        (ctx,source,(TypeGenericClassProto *)type[1]._vptr_TypeBase,&local_48);
  }
LAB_001f5fb2:
  if (type != (TypeBase *)0x0) {
    return &pTVar11->super_TypeBase;
  }
  msg = "ERROR: unknown generic type resolve";
LAB_001f5fdb:
  anon_unknown.dwarf_11255e::Stop(ctx,source,msg);
}

Assistant:

TypeBase* ResolveGenericTypeAliases(ExpressionContext &ctx, SynBase *source, TypeBase *type, IntrusiveList<MatchData> aliases)
{
	if(!type->isGeneric || aliases.empty())
		return type;

	// Replace with alias type if there is a match, otherwise leave as generic
	if(isType<TypeGeneric>(type))
		return type;

	// Replace with alias type if there is a match, otherwise leave as generic
	if(TypeGenericAlias *lhs = getType<TypeGenericAlias>(type))
	{
		for(MatchData *curr = aliases.head; curr; curr = curr->next)
		{
			if(curr->name->name == lhs->baseName->name)
				return curr->type;
		}

		return ctx.typeGeneric;
	}

	if(TypeRef *lhs = getType<TypeRef>(type))
		return ctx.GetReferenceType(ResolveGenericTypeAliases(ctx, source, lhs->subType, aliases));

	if(TypeArray *lhs = getType<TypeArray>(type))
		return ctx.GetArrayType(ResolveGenericTypeAliases(ctx, source, lhs->subType, aliases), lhs->length);

	if(TypeUnsizedArray *lhs = getType<TypeUnsizedArray>(type))
		return ctx.GetUnsizedArrayType(ResolveGenericTypeAliases(ctx, source, lhs->subType, aliases));

	if(TypeFunction *lhs = getType<TypeFunction>(type))
	{
		TypeBase *returnType = ResolveGenericTypeAliases(ctx, source, lhs->returnType, aliases);

		IntrusiveList<TypeHandle> arguments;

		for(TypeHandle *curr = lhs->arguments.head; curr; curr = curr->next)
			arguments.push_back(new (ctx.get<TypeHandle>()) TypeHandle(ResolveGenericTypeAliases(ctx, source, curr->type, aliases)));

		return ctx.GetFunctionType(source, returnType, arguments);
	}

	if(TypeGenericClass *lhs = getType<TypeGenericClass>(type))
	{
		bool isGeneric = false;
		IntrusiveList<TypeHandle> types;

		for(TypeHandle *curr = lhs->generics.head; curr; curr = curr->next)
		{
			TypeBase *resolvedType = ResolveGenericTypeAliases(ctx, source, curr->type, aliases);

			if(resolvedType == ctx.typeAuto)
				Stop(ctx, source, "ERROR: 'auto' type cannot be used as template argument");

			isGeneric |= resolvedType->isGeneric;

			types.push_back(new (ctx.get<TypeHandle>()) TypeHandle(resolvedType));
		}

		if(isGeneric)
			return ctx.GetGenericClassType(source, lhs->proto, types);

		return CreateGenericTypeInstance(ctx, source, lhs->proto, types);
	}

	Stop(ctx, source, "ERROR: unknown generic type resolve");

	return NULL;
}